

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O2

Aig_ManPack_t * Aig_ManPackAlloc(Aig_Man_t *pAig)

{
  Aig_ManPack_t *pAVar1;
  Vec_Wrd_t *pVVar2;
  
  pAVar1 = (Aig_ManPack_t *)calloc(1,0x38);
  pAVar1->pAig = pAig;
  pVVar2 = Vec_WrdStart(pAig->vObjs->nSize);
  pAVar1->vSigns = pVVar2;
  pVVar2 = Vec_WrdStart(pAig->nObjs[2]);
  pAVar1->vPiPats = pVVar2;
  pVVar2 = Vec_WrdStart(pAig->nObjs[2]);
  pAVar1->vPiCare = pVVar2;
  pAVar1->iPatCur = 1;
  return pAVar1;
}

Assistant:

Aig_ManPack_t * Aig_ManPackAlloc( Aig_Man_t * pAig )
{
    Aig_ManPack_t * p;
    p = ABC_CALLOC( Aig_ManPack_t, 1 );
    p->pAig    = pAig;
    p->vSigns  = Vec_WrdStart( Aig_ManObjNumMax(pAig) );
    p->vPiPats = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->vPiCare = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->iPatCur = 1;
    return p;
}